

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expr.cpp
# Opt level: O0

void __thiscall phaeton::BrackExpr::dump(BrackExpr *this,uint Indent)

{
  ASTNodeList<const_phaeton::Expression,_(phaeton::ASTNode::ASTNodeKind)3,_phaeton::ExprList>
  *this_00;
  undefined4 uVar1;
  int iVar2;
  mapped_type *pmVar3;
  ostream *poVar4;
  string local_1f8 [48];
  stringstream local_1c8 [8];
  stringstream StrStream;
  ostream local_1b8 [380];
  ASTNodeKind local_3c;
  string local_38 [8];
  string Str;
  uint Indent_local;
  BrackExpr *this_local;
  
  Str.field_2._12_4_ = Indent;
  local_3c = ASTNode::getASTNodeKind((ASTNode *)this);
  pmVar3 = std::
           map<phaeton::ASTNode::ASTNodeKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<phaeton::ASTNode::ASTNodeKind>,_std::allocator<std::pair<const_phaeton::ASTNode::ASTNodeKind,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&ASTNode::NodeLabel_abi_cxx11_,&local_3c);
  std::__cxx11::string::string(local_38,(string *)pmVar3);
  std::__cxx11::stringstream::stringstream(local_1c8);
  poVar4 = std::operator<<(local_1b8," <");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::hex);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,this);
  std::operator<<(poVar4,">");
  std::ios_base::width
            ((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),
             (ulong)(uint)Str.field_2._12_4_);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::left);
  std::operator<<(poVar4,"");
  std::ios_base::unsetf
            ((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),_S_adjustfield);
  poVar4 = std::operator<<((ostream *)&std::cout,"(");
  poVar4 = std::operator<<(poVar4,local_38);
  std::__cxx11::stringstream::str();
  poVar4 = std::operator<<(poVar4,local_1f8);
  std::operator<<(poVar4,"\n");
  std::__cxx11::string::~string(local_1f8);
  uVar1 = Str.field_2._12_4_;
  this_00 = &this->Exprs->
             super_ASTNodeList<const_phaeton::Expression,_(phaeton::ASTNode::ASTNodeKind)3,_phaeton::ExprList>
  ;
  iVar2 = std::__cxx11::string::length();
  ASTNodeList<const_phaeton::Expression,_(phaeton::ASTNode::ASTNodeKind)3,_phaeton::ExprList>::dump
            (this_00,uVar1 + 1 + iVar2);
  std::ios_base::width
            ((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),
             (ulong)(Str.field_2._12_4_ + 1));
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::left);
  std::operator<<(poVar4,"");
  std::ios_base::unsetf
            ((ios_base *)((long)&std::cout + *(long *)(std::cout + -0x18)),_S_adjustfield);
  std::operator<<((ostream *)&std::cout,")\n");
  std::__cxx11::stringstream::~stringstream(local_1c8);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void BrackExpr::dump(unsigned Indent) const {
  std::string Str = NodeLabel[getASTNodeKind()];

  std::stringstream StrStream;
  StrStream << " <" << std::hex << this << ">";

  FORMAT_AST_INDENT(Indent)
  std::cout << "(" << Str << StrStream.str() << "\n";
  Exprs->dump(Indent + Str.length() + 1);
  FORMAT_AST_INDENT(Indent + 1)
  std::cout << ")\n";
}